

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  ulong uVar241;
  byte bVar242;
  byte bVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  byte bVar248;
  byte bVar249;
  byte bVar250;
  byte bVar251;
  byte bVar252;
  byte bVar253;
  byte bVar254;
  byte bVar255;
  byte bVar256;
  byte bVar257;
  ulong uVar258;
  ulong uVar259;
  ulong uVar260;
  long lVar261;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  
  uVar241 = (ulong)(len >> 3);
  if (len < 0x80) {
    uVar260 = 0;
  }
  else {
    auVar279 = vmovdqa64_avx512vl(_DAT_00116060);
    auVar280 = vmovdqa64_avx512vl(_DAT_00116070);
    uVar259 = 0;
    uVar258 = 0x10;
    do {
      uVar260 = uVar258;
      auVar262 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x50));
      auVar263 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x60));
      auVar264 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x70));
      lVar261 = 0x20;
      auVar277 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8),auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 8));
      auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 8),auVar280,
                                   *(undefined1 (*) [16])(array + uVar259 * 8));
      auVar265 = vmovdqa64_avx512vl(auVar263);
      auVar278 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x10),auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x18));
      auVar269 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x18),auVar280,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x10));
      auVar266 = vmovdqa64_avx512vl(auVar264);
      auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x20),auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x28));
      auVar272 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x28),auVar280,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x20));
      auVar273 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x30),auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x38));
      auVar274 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x38),auVar280,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x30));
      auVar275 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x40),auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x48));
      auVar276 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x48),auVar280,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x40));
      auVar267 = vmovdqa64_avx512vl(auVar262);
      auVar267 = vpermt2b_avx512vl(auVar267,auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x58));
      auVar268 = vpermt2b_avx512vl(auVar265,auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x68));
      auVar266 = vpermt2b_avx512vl(auVar266,auVar279,
                                   *(undefined1 (*) [16])(array + uVar259 * 8 + 0x78));
      auVar265 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x58),auVar280,
                                   auVar262);
      auVar262 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x68),auVar280,
                                   auVar263);
      auVar263 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar259 * 8 + 0x78),auVar280,
                                   auVar264);
      do {
        auVar264 = auVar278 >> 7;
        auVar17 = auVar278 >> 0xf;
        auVar33 = auVar278 >> 0x17;
        auVar65 = auVar278 >> 0x1f;
        auVar113 = auVar278 >> 0x27;
        auVar161 = auVar278 >> 0x2f;
        auVar209 = auVar278 >> 0x37;
        auVar49 = auVar278 >> 0x3f;
        auVar73 = auVar278 >> 0x47;
        auVar97 = auVar278 >> 0x4f;
        auVar121 = auVar278 >> 0x57;
        auVar145 = auVar278 >> 0x5f;
        auVar169 = auVar278 >> 0x67;
        auVar193 = auVar278 >> 0x6f;
        auVar217 = auVar278 >> 0x77;
        bVar242 = auVar278[0xf];
        auVar2 = auVar270 >> 7;
        auVar18 = auVar270 >> 0xf;
        auVar34 = auVar270 >> 0x17;
        auVar66 = auVar270 >> 0x1f;
        auVar114 = auVar270 >> 0x27;
        auVar162 = auVar270 >> 0x2f;
        auVar210 = auVar270 >> 0x37;
        auVar50 = auVar270 >> 0x3f;
        auVar74 = auVar270 >> 0x47;
        auVar98 = auVar270 >> 0x4f;
        auVar122 = auVar270 >> 0x57;
        auVar146 = auVar270 >> 0x5f;
        auVar170 = auVar270 >> 0x67;
        auVar194 = auVar270 >> 0x6f;
        auVar218 = auVar270 >> 0x77;
        bVar243 = auVar270[0xf];
        auVar3 = auVar269 >> 7;
        auVar19 = auVar269 >> 0xf;
        auVar35 = auVar269 >> 0x17;
        auVar67 = auVar269 >> 0x1f;
        auVar115 = auVar269 >> 0x27;
        auVar163 = auVar269 >> 0x2f;
        auVar211 = auVar269 >> 0x37;
        auVar51 = auVar269 >> 0x3f;
        auVar75 = auVar269 >> 0x47;
        auVar99 = auVar269 >> 0x4f;
        auVar123 = auVar269 >> 0x57;
        auVar147 = auVar269 >> 0x5f;
        auVar171 = auVar269 >> 0x67;
        auVar195 = auVar269 >> 0x6f;
        auVar219 = auVar269 >> 0x77;
        bVar244 = auVar269[0xf];
        auVar4 = auVar277 >> 7;
        auVar20 = auVar277 >> 0xf;
        auVar36 = auVar277 >> 0x17;
        auVar68 = auVar277 >> 0x1f;
        auVar116 = auVar277 >> 0x27;
        auVar164 = auVar277 >> 0x2f;
        auVar212 = auVar277 >> 0x37;
        auVar52 = auVar277 >> 0x3f;
        auVar76 = auVar277 >> 0x47;
        auVar100 = auVar277 >> 0x4f;
        auVar124 = auVar277 >> 0x57;
        auVar148 = auVar277 >> 0x5f;
        auVar172 = auVar277 >> 0x67;
        auVar196 = auVar277 >> 0x6f;
        auVar220 = auVar277 >> 0x77;
        bVar245 = auVar277[0xf];
        auVar277 = vpaddb_avx(auVar277,auVar277);
        auVar278 = vpaddb_avx(auVar278,auVar278);
        auVar269 = vpaddb_avx(auVar269,auVar269);
        auVar270 = vpaddb_avx(auVar270,auVar270);
        auVar5 = auVar271 >> 7;
        auVar21 = auVar271 >> 0xf;
        auVar37 = auVar271 >> 0x17;
        auVar69 = auVar271 >> 0x1f;
        auVar117 = auVar271 >> 0x27;
        auVar165 = auVar271 >> 0x2f;
        auVar213 = auVar271 >> 0x37;
        auVar53 = auVar271 >> 0x3f;
        auVar77 = auVar271 >> 0x47;
        auVar101 = auVar271 >> 0x4f;
        auVar125 = auVar271 >> 0x57;
        auVar149 = auVar271 >> 0x5f;
        auVar173 = auVar271 >> 0x67;
        auVar197 = auVar271 >> 0x6f;
        auVar221 = auVar271 >> 0x77;
        bVar246 = auVar271[0xf];
        auVar271 = vpaddb_avx(auVar271,auVar271);
        auVar6 = auVar272 >> 7;
        auVar22 = auVar272 >> 0xf;
        auVar38 = auVar272 >> 0x17;
        auVar70 = auVar272 >> 0x1f;
        auVar118 = auVar272 >> 0x27;
        auVar166 = auVar272 >> 0x2f;
        auVar214 = auVar272 >> 0x37;
        auVar54 = auVar272 >> 0x3f;
        auVar78 = auVar272 >> 0x47;
        auVar102 = auVar272 >> 0x4f;
        auVar126 = auVar272 >> 0x57;
        auVar150 = auVar272 >> 0x5f;
        auVar174 = auVar272 >> 0x67;
        auVar198 = auVar272 >> 0x6f;
        auVar222 = auVar272 >> 0x77;
        bVar247 = auVar272[0xf];
        auVar272 = vpaddb_avx(auVar272,auVar272);
        auVar7 = auVar273 >> 7;
        auVar23 = auVar273 >> 0xf;
        auVar39 = auVar273 >> 0x17;
        auVar71 = auVar273 >> 0x1f;
        auVar119 = auVar273 >> 0x27;
        auVar167 = auVar273 >> 0x2f;
        auVar215 = auVar273 >> 0x37;
        auVar55 = auVar273 >> 0x3f;
        auVar79 = auVar273 >> 0x47;
        auVar103 = auVar273 >> 0x4f;
        auVar127 = auVar273 >> 0x57;
        auVar151 = auVar273 >> 0x5f;
        auVar175 = auVar273 >> 0x67;
        auVar199 = auVar273 >> 0x6f;
        auVar223 = auVar273 >> 0x77;
        bVar248 = auVar273[0xf];
        auVar273 = vpaddb_avx(auVar273,auVar273);
        auVar8 = auVar274 >> 7;
        auVar24 = auVar274 >> 0xf;
        auVar40 = auVar274 >> 0x17;
        auVar72 = auVar274 >> 0x1f;
        auVar120 = auVar274 >> 0x27;
        auVar168 = auVar274 >> 0x2f;
        auVar216 = auVar274 >> 0x37;
        auVar56 = auVar274 >> 0x3f;
        auVar80 = auVar274 >> 0x47;
        auVar104 = auVar274 >> 0x4f;
        auVar128 = auVar274 >> 0x57;
        auVar152 = auVar274 >> 0x5f;
        auVar176 = auVar274 >> 0x67;
        auVar200 = auVar274 >> 0x6f;
        auVar224 = auVar274 >> 0x77;
        bVar249 = auVar274[0xf];
        auVar274 = vpaddb_avx(auVar274,auVar274);
        auVar9 = auVar275 >> 7;
        auVar25 = auVar275 >> 0xf;
        auVar41 = auVar275 >> 0x17;
        auVar89 = auVar275 >> 0x1f;
        auVar137 = auVar275 >> 0x27;
        auVar185 = auVar275 >> 0x2f;
        auVar233 = auVar275 >> 0x37;
        auVar57 = auVar275 >> 0x3f;
        auVar81 = auVar275 >> 0x47;
        auVar105 = auVar275 >> 0x4f;
        auVar129 = auVar275 >> 0x57;
        auVar153 = auVar275 >> 0x5f;
        auVar177 = auVar275 >> 0x67;
        auVar201 = auVar275 >> 0x6f;
        auVar225 = auVar275 >> 0x77;
        bVar250 = auVar275[0xf];
        auVar275 = vpaddb_avx(auVar275,auVar275);
        auVar10 = auVar276 >> 7;
        auVar26 = auVar276 >> 0xf;
        auVar42 = auVar276 >> 0x17;
        auVar90 = auVar276 >> 0x1f;
        auVar138 = auVar276 >> 0x27;
        auVar186 = auVar276 >> 0x2f;
        auVar234 = auVar276 >> 0x37;
        auVar58 = auVar276 >> 0x3f;
        auVar82 = auVar276 >> 0x47;
        auVar106 = auVar276 >> 0x4f;
        auVar130 = auVar276 >> 0x57;
        auVar154 = auVar276 >> 0x5f;
        auVar178 = auVar276 >> 0x67;
        auVar202 = auVar276 >> 0x6f;
        auVar226 = auVar276 >> 0x77;
        bVar251 = auVar276[0xf];
        auVar276 = vpaddb_avx(auVar276,auVar276);
        auVar11 = auVar267 >> 7;
        auVar27 = auVar267 >> 0xf;
        auVar43 = auVar267 >> 0x17;
        auVar91 = auVar267 >> 0x1f;
        auVar139 = auVar267 >> 0x27;
        auVar187 = auVar267 >> 0x2f;
        auVar235 = auVar267 >> 0x37;
        auVar59 = auVar267 >> 0x3f;
        auVar83 = auVar267 >> 0x47;
        auVar107 = auVar267 >> 0x4f;
        auVar131 = auVar267 >> 0x57;
        auVar155 = auVar267 >> 0x5f;
        auVar179 = auVar267 >> 0x67;
        auVar203 = auVar267 >> 0x6f;
        auVar227 = auVar267 >> 0x77;
        bVar252 = auVar267[0xf];
        auVar267 = vpaddb_avx(auVar267,auVar267);
        auVar12 = auVar262 >> 7;
        auVar28 = auVar262 >> 0xf;
        auVar44 = auVar262 >> 0x17;
        auVar92 = auVar262 >> 0x1f;
        auVar140 = auVar262 >> 0x27;
        auVar188 = auVar262 >> 0x2f;
        auVar236 = auVar262 >> 0x37;
        auVar60 = auVar262 >> 0x3f;
        auVar84 = auVar262 >> 0x47;
        auVar108 = auVar262 >> 0x4f;
        auVar132 = auVar262 >> 0x57;
        auVar156 = auVar262 >> 0x5f;
        auVar180 = auVar262 >> 0x67;
        auVar204 = auVar262 >> 0x6f;
        auVar228 = auVar262 >> 0x77;
        bVar253 = auVar262[0xf];
        auVar262 = vpaddb_avx(auVar262,auVar262);
        auVar13 = auVar265 >> 7;
        auVar29 = auVar265 >> 0xf;
        auVar45 = auVar265 >> 0x17;
        auVar93 = auVar265 >> 0x1f;
        auVar141 = auVar265 >> 0x27;
        auVar189 = auVar265 >> 0x2f;
        auVar237 = auVar265 >> 0x37;
        auVar61 = auVar265 >> 0x3f;
        auVar85 = auVar265 >> 0x47;
        auVar109 = auVar265 >> 0x4f;
        auVar133 = auVar265 >> 0x57;
        auVar157 = auVar265 >> 0x5f;
        auVar181 = auVar265 >> 0x67;
        auVar205 = auVar265 >> 0x6f;
        auVar229 = auVar265 >> 0x77;
        bVar254 = auVar265[0xf];
        auVar265 = vpaddb_avx(auVar265,auVar265);
        auVar14 = auVar266 >> 7;
        auVar30 = auVar266 >> 0xf;
        auVar46 = auVar266 >> 0x17;
        auVar94 = auVar266 >> 0x1f;
        auVar142 = auVar266 >> 0x27;
        auVar190 = auVar266 >> 0x2f;
        auVar238 = auVar266 >> 0x37;
        auVar62 = auVar266 >> 0x3f;
        auVar86 = auVar266 >> 0x47;
        auVar110 = auVar266 >> 0x4f;
        auVar134 = auVar266 >> 0x57;
        auVar158 = auVar266 >> 0x5f;
        auVar182 = auVar266 >> 0x67;
        auVar206 = auVar266 >> 0x6f;
        auVar230 = auVar266 >> 0x77;
        bVar255 = auVar266[0xf];
        auVar266 = vpaddb_avx(auVar266,auVar266);
        auVar15 = auVar268 >> 7;
        auVar31 = auVar268 >> 0xf;
        auVar47 = auVar268 >> 0x17;
        auVar95 = auVar268 >> 0x1f;
        auVar143 = auVar268 >> 0x27;
        auVar191 = auVar268 >> 0x2f;
        auVar239 = auVar268 >> 0x37;
        auVar63 = auVar268 >> 0x3f;
        auVar87 = auVar268 >> 0x47;
        auVar111 = auVar268 >> 0x4f;
        auVar135 = auVar268 >> 0x57;
        auVar159 = auVar268 >> 0x5f;
        auVar183 = auVar268 >> 0x67;
        auVar207 = auVar268 >> 0x6f;
        auVar231 = auVar268 >> 0x77;
        bVar256 = auVar268[0xf];
        auVar268 = vpaddb_avx(auVar268,auVar268);
        auVar16 = auVar263 >> 7;
        auVar32 = auVar263 >> 0xf;
        auVar48 = auVar263 >> 0x17;
        auVar96 = auVar263 >> 0x1f;
        auVar144 = auVar263 >> 0x27;
        auVar192 = auVar263 >> 0x2f;
        auVar240 = auVar263 >> 0x37;
        auVar64 = auVar263 >> 0x3f;
        auVar88 = auVar263 >> 0x47;
        auVar112 = auVar263 >> 0x4f;
        auVar136 = auVar263 >> 0x57;
        auVar160 = auVar263 >> 0x5f;
        auVar184 = auVar263 >> 0x67;
        auVar208 = auVar263 >> 0x6f;
        auVar232 = auVar263 >> 0x77;
        bVar257 = auVar263[0xf];
        auVar263 = vpaddb_avx(auVar263,auVar263);
        *(int *)((long)flags + lVar261 + -4) =
             POPCOUNT((uint)(ushort)((ushort)(auVar14[0] & 1) | (ushort)(auVar30[0] & 1) << 1 |
                                     (ushort)(auVar46[0] & 1) << 2 | (ushort)(auVar94[0] & 1) << 3 |
                                     (ushort)(auVar142[0] & 1) << 4 | (ushort)(auVar190[0] & 1) << 5
                                     | (ushort)(auVar238[0] & 1) << 6 |
                                     (ushort)(auVar62[0] & 1) << 7 | (ushort)(auVar86[0] & 1) << 8 |
                                     (ushort)(auVar110[0] & 1) << 9 |
                                     (ushort)(auVar134[0] & 1) << 10 |
                                     (ushort)(auVar158[0] & 1) << 0xb |
                                     (ushort)(auVar182[0] & 1) << 0xc |
                                     (ushort)(auVar206[0] & 1) << 0xd |
                                     (ushort)(auVar230[0] & 1) << 0xe |
                                    (ushort)(bVar255 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar15[0] & 1) | (ushort)(auVar31[0] & 1) << 1 |
                                     (ushort)(auVar47[0] & 1) << 2 | (ushort)(auVar95[0] & 1) << 3 |
                                     (ushort)(auVar143[0] & 1) << 4 | (ushort)(auVar191[0] & 1) << 5
                                     | (ushort)(auVar239[0] & 1) << 6 |
                                     (ushort)(auVar63[0] & 1) << 7 | (ushort)(auVar87[0] & 1) << 8 |
                                     (ushort)(auVar111[0] & 1) << 9 |
                                     (ushort)(auVar135[0] & 1) << 10 |
                                     (ushort)(auVar159[0] & 1) << 0xb |
                                     (ushort)(auVar183[0] & 1) << 0xc |
                                     (ushort)(auVar207[0] & 1) << 0xd |
                                     (ushort)(auVar231[0] & 1) << 0xe |
                                    (ushort)(bVar256 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar11[0] & 1) | (ushort)(auVar27[0] & 1) << 1 |
                                     (ushort)(auVar43[0] & 1) << 2 | (ushort)(auVar91[0] & 1) << 3 |
                                     (ushort)(auVar139[0] & 1) << 4 | (ushort)(auVar187[0] & 1) << 5
                                     | (ushort)(auVar235[0] & 1) << 6 |
                                     (ushort)(auVar59[0] & 1) << 7 | (ushort)(auVar83[0] & 1) << 8 |
                                     (ushort)(auVar107[0] & 1) << 9 |
                                     (ushort)(auVar131[0] & 1) << 10 |
                                     (ushort)(auVar155[0] & 1) << 0xb |
                                     (ushort)(auVar179[0] & 1) << 0xc |
                                     (ushort)(auVar203[0] & 1) << 0xd |
                                     (ushort)(auVar227[0] & 1) << 0xe |
                                    (ushort)(bVar252 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar9[0] & 1) | (ushort)(auVar25[0] & 1) << 1 |
                                     (ushort)(auVar41[0] & 1) << 2 | (ushort)(auVar89[0] & 1) << 3 |
                                     (ushort)(auVar137[0] & 1) << 4 | (ushort)(auVar185[0] & 1) << 5
                                     | (ushort)(auVar233[0] & 1) << 6 |
                                     (ushort)(auVar57[0] & 1) << 7 | (ushort)(auVar81[0] & 1) << 8 |
                                     (ushort)(auVar105[0] & 1) << 9 |
                                     (ushort)(auVar129[0] & 1) << 10 |
                                     (ushort)(auVar153[0] & 1) << 0xb |
                                     (ushort)(auVar177[0] & 1) << 0xc |
                                     (ushort)(auVar201[0] & 1) << 0xd |
                                     (ushort)(auVar225[0] & 1) << 0xe |
                                    (ushort)(bVar250 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar7[0] & 1) | (ushort)(auVar23[0] & 1) << 1 |
                                     (ushort)(auVar39[0] & 1) << 2 | (ushort)(auVar71[0] & 1) << 3 |
                                     (ushort)(auVar119[0] & 1) << 4 | (ushort)(auVar167[0] & 1) << 5
                                     | (ushort)(auVar215[0] & 1) << 6 |
                                     (ushort)(auVar55[0] & 1) << 7 | (ushort)(auVar79[0] & 1) << 8 |
                                     (ushort)(auVar103[0] & 1) << 9 |
                                     (ushort)(auVar127[0] & 1) << 10 |
                                     (ushort)(auVar151[0] & 1) << 0xb |
                                     (ushort)(auVar175[0] & 1) << 0xc |
                                     (ushort)(auVar199[0] & 1) << 0xd |
                                     (ushort)(auVar223[0] & 1) << 0xe |
                                    (ushort)(bVar248 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar2[0] & 1) | (ushort)(auVar18[0] & 1) << 1 |
                                     (ushort)(auVar34[0] & 1) << 2 | (ushort)(auVar66[0] & 1) << 3 |
                                     (ushort)(auVar114[0] & 1) << 4 | (ushort)(auVar162[0] & 1) << 5
                                     | (ushort)(auVar210[0] & 1) << 6 |
                                     (ushort)(auVar50[0] & 1) << 7 | (ushort)(auVar74[0] & 1) << 8 |
                                     (ushort)(auVar98[0] & 1) << 9 | (ushort)(auVar122[0] & 1) << 10
                                     | (ushort)(auVar146[0] & 1) << 0xb |
                                     (ushort)(auVar170[0] & 1) << 0xc |
                                     (ushort)(auVar194[0] & 1) << 0xd |
                                     (ushort)(auVar218[0] & 1) << 0xe |
                                    (ushort)(bVar243 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar264[0] & 1) | (ushort)(auVar17[0] & 1) << 1 |
                                     (ushort)(auVar33[0] & 1) << 2 | (ushort)(auVar65[0] & 1) << 3 |
                                     (ushort)(auVar113[0] & 1) << 4 | (ushort)(auVar161[0] & 1) << 5
                                     | (ushort)(auVar209[0] & 1) << 6 |
                                     (ushort)(auVar49[0] & 1) << 7 | (ushort)(auVar73[0] & 1) << 8 |
                                     (ushort)(auVar97[0] & 1) << 9 | (ushort)(auVar121[0] & 1) << 10
                                     | (ushort)(auVar145[0] & 1) << 0xb |
                                     (ushort)(auVar169[0] & 1) << 0xc |
                                     (ushort)(auVar193[0] & 1) << 0xd |
                                     (ushort)(auVar217[0] & 1) << 0xe |
                                    (ushort)(bVar242 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar4[0] & 1) | (ushort)(auVar20[0] & 1) << 1 |
                                     (ushort)(auVar36[0] & 1) << 2 | (ushort)(auVar68[0] & 1) << 3 |
                                     (ushort)(auVar116[0] & 1) << 4 | (ushort)(auVar164[0] & 1) << 5
                                     | (ushort)(auVar212[0] & 1) << 6 |
                                     (ushort)(auVar52[0] & 1) << 7 | (ushort)(auVar76[0] & 1) << 8 |
                                     (ushort)(auVar100[0] & 1) << 9 |
                                     (ushort)(auVar124[0] & 1) << 10 |
                                     (ushort)(auVar148[0] & 1) << 0xb |
                                     (ushort)(auVar172[0] & 1) << 0xc |
                                     (ushort)(auVar196[0] & 1) << 0xd |
                                     (ushort)(auVar220[0] & 1) << 0xe |
                                    (ushort)(bVar245 >> 7) << 0xf)) +
             *(int *)((long)flags + lVar261 + -4);
        *(int *)((long)flags + lVar261 + 0x1c) =
             POPCOUNT((uint)(ushort)((ushort)(auVar16[0] & 1) | (ushort)(auVar32[0] & 1) << 1 |
                                     (ushort)(auVar48[0] & 1) << 2 | (ushort)(auVar96[0] & 1) << 3 |
                                     (ushort)(auVar144[0] & 1) << 4 | (ushort)(auVar192[0] & 1) << 5
                                     | (ushort)(auVar240[0] & 1) << 6 |
                                     (ushort)(auVar64[0] & 1) << 7 | (ushort)(auVar88[0] & 1) << 8 |
                                     (ushort)(auVar112[0] & 1) << 9 |
                                     (ushort)(auVar136[0] & 1) << 10 |
                                     (ushort)(auVar160[0] & 1) << 0xb |
                                     (ushort)(auVar184[0] & 1) << 0xc |
                                     (ushort)(auVar208[0] & 1) << 0xd |
                                     (ushort)(auVar232[0] & 1) << 0xe |
                                    (ushort)(bVar257 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar12[0] & 1) | (ushort)(auVar28[0] & 1) << 1 |
                                     (ushort)(auVar44[0] & 1) << 2 | (ushort)(auVar92[0] & 1) << 3 |
                                     (ushort)(auVar140[0] & 1) << 4 | (ushort)(auVar188[0] & 1) << 5
                                     | (ushort)(auVar236[0] & 1) << 6 |
                                     (ushort)(auVar60[0] & 1) << 7 | (ushort)(auVar84[0] & 1) << 8 |
                                     (ushort)(auVar108[0] & 1) << 9 |
                                     (ushort)(auVar132[0] & 1) << 10 |
                                     (ushort)(auVar156[0] & 1) << 0xb |
                                     (ushort)(auVar180[0] & 1) << 0xc |
                                     (ushort)(auVar204[0] & 1) << 0xd |
                                     (ushort)(auVar228[0] & 1) << 0xe |
                                    (ushort)(bVar253 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar13[0] & 1) | (ushort)(auVar29[0] & 1) << 1 |
                                     (ushort)(auVar45[0] & 1) << 2 | (ushort)(auVar93[0] & 1) << 3 |
                                     (ushort)(auVar141[0] & 1) << 4 | (ushort)(auVar189[0] & 1) << 5
                                     | (ushort)(auVar237[0] & 1) << 6 |
                                     (ushort)(auVar61[0] & 1) << 7 | (ushort)(auVar85[0] & 1) << 8 |
                                     (ushort)(auVar109[0] & 1) << 9 |
                                     (ushort)(auVar133[0] & 1) << 10 |
                                     (ushort)(auVar157[0] & 1) << 0xb |
                                     (ushort)(auVar181[0] & 1) << 0xc |
                                     (ushort)(auVar205[0] & 1) << 0xd |
                                     (ushort)(auVar229[0] & 1) << 0xe |
                                    (ushort)(bVar254 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar10[0] & 1) | (ushort)(auVar26[0] & 1) << 1 |
                                     (ushort)(auVar42[0] & 1) << 2 | (ushort)(auVar90[0] & 1) << 3 |
                                     (ushort)(auVar138[0] & 1) << 4 | (ushort)(auVar186[0] & 1) << 5
                                     | (ushort)(auVar234[0] & 1) << 6 |
                                     (ushort)(auVar58[0] & 1) << 7 | (ushort)(auVar82[0] & 1) << 8 |
                                     (ushort)(auVar106[0] & 1) << 9 |
                                     (ushort)(auVar130[0] & 1) << 10 |
                                     (ushort)(auVar154[0] & 1) << 0xb |
                                     (ushort)(auVar178[0] & 1) << 0xc |
                                     (ushort)(auVar202[0] & 1) << 0xd |
                                     (ushort)(auVar226[0] & 1) << 0xe |
                                    (ushort)(bVar251 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar8[0] & 1) | (ushort)(auVar24[0] & 1) << 1 |
                                     (ushort)(auVar40[0] & 1) << 2 | (ushort)(auVar72[0] & 1) << 3 |
                                     (ushort)(auVar120[0] & 1) << 4 | (ushort)(auVar168[0] & 1) << 5
                                     | (ushort)(auVar216[0] & 1) << 6 |
                                     (ushort)(auVar56[0] & 1) << 7 | (ushort)(auVar80[0] & 1) << 8 |
                                     (ushort)(auVar104[0] & 1) << 9 |
                                     (ushort)(auVar128[0] & 1) << 10 |
                                     (ushort)(auVar152[0] & 1) << 0xb |
                                     (ushort)(auVar176[0] & 1) << 0xc |
                                     (ushort)(auVar200[0] & 1) << 0xd |
                                     (ushort)(auVar224[0] & 1) << 0xe |
                                    (ushort)(bVar249 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar6[0] & 1) | (ushort)(auVar22[0] & 1) << 1 |
                                     (ushort)(auVar38[0] & 1) << 2 | (ushort)(auVar70[0] & 1) << 3 |
                                     (ushort)(auVar118[0] & 1) << 4 | (ushort)(auVar166[0] & 1) << 5
                                     | (ushort)(auVar214[0] & 1) << 6 |
                                     (ushort)(auVar54[0] & 1) << 7 | (ushort)(auVar78[0] & 1) << 8 |
                                     (ushort)(auVar102[0] & 1) << 9 |
                                     (ushort)(auVar126[0] & 1) << 10 |
                                     (ushort)(auVar150[0] & 1) << 0xb |
                                     (ushort)(auVar174[0] & 1) << 0xc |
                                     (ushort)(auVar198[0] & 1) << 0xd |
                                     (ushort)(auVar222[0] & 1) << 0xe |
                                    (ushort)(bVar247 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar3[0] & 1) | (ushort)(auVar19[0] & 1) << 1 |
                                     (ushort)(auVar35[0] & 1) << 2 | (ushort)(auVar67[0] & 1) << 3 |
                                     (ushort)(auVar115[0] & 1) << 4 | (ushort)(auVar163[0] & 1) << 5
                                     | (ushort)(auVar211[0] & 1) << 6 |
                                     (ushort)(auVar51[0] & 1) << 7 | (ushort)(auVar75[0] & 1) << 8 |
                                     (ushort)(auVar99[0] & 1) << 9 | (ushort)(auVar123[0] & 1) << 10
                                     | (ushort)(auVar147[0] & 1) << 0xb |
                                     (ushort)(auVar171[0] & 1) << 0xc |
                                     (ushort)(auVar195[0] & 1) << 0xd |
                                     (ushort)(auVar219[0] & 1) << 0xe |
                                    (ushort)(bVar244 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar5[0] & 1) | (ushort)(auVar21[0] & 1) << 1 |
                                     (ushort)(auVar37[0] & 1) << 2 | (ushort)(auVar69[0] & 1) << 3 |
                                     (ushort)(auVar117[0] & 1) << 4 | (ushort)(auVar165[0] & 1) << 5
                                     | (ushort)(auVar213[0] & 1) << 6 |
                                     (ushort)(auVar53[0] & 1) << 7 | (ushort)(auVar77[0] & 1) << 8 |
                                     (ushort)(auVar101[0] & 1) << 9 |
                                     (ushort)(auVar125[0] & 1) << 10 |
                                     (ushort)(auVar149[0] & 1) << 0xb |
                                     (ushort)(auVar173[0] & 1) << 0xc |
                                     (ushort)(auVar197[0] & 1) << 0xd |
                                     (ushort)(auVar221[0] & 1) << 0xe |
                                    (ushort)(bVar246 >> 7) << 0xf)) +
             *(int *)((long)flags + lVar261 + 0x1c);
        lVar261 = lVar261 + -4;
      } while (lVar261 != 0);
      uVar259 = uVar260;
      uVar258 = uVar260 + 0x10;
    } while (uVar260 + 0x10 <= uVar241);
  }
  auVar278 = _DAT_00116070;
  auVar277 = _DAT_00116060;
  uVar259 = uVar260 | 8;
  auVar279 = _DAT_00116060;
  auVar280 = _DAT_00116070;
  while (uVar258 = uVar259, auVar269 = auVar279, auVar270 = auVar280, uVar258 <= uVar241) {
    lVar261 = 0x20;
    auVar269 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8),auVar277,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 8));
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 8),auVar278,
                                 *(undefined1 (*) [16])(array + uVar260 * 8));
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x10),auVar277,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x18));
    auVar272 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x18),auVar278,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x10));
    auVar273 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x20),auVar277,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x28));
    auVar274 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x28),auVar278,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x20));
    auVar275 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x30),auVar277,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x38));
    auVar276 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x38),auVar278,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x30));
    _DAT_00116060 = auVar279;
    _DAT_00116070 = auVar280;
    do {
      auVar279 = auVar271 >> 7;
      auVar264 = auVar271 >> 0xf;
      auVar9 = auVar271 >> 0x17;
      auVar17 = auVar271 >> 0x1f;
      auVar25 = auVar271 >> 0x27;
      auVar33 = auVar271 >> 0x2f;
      auVar41 = auVar271 >> 0x37;
      auVar65 = auVar271 >> 0x3f;
      auVar89 = auVar271 >> 0x47;
      auVar113 = auVar271 >> 0x4f;
      auVar137 = auVar271 >> 0x57;
      auVar161 = auVar271 >> 0x5f;
      auVar185 = auVar271 >> 0x67;
      auVar209 = auVar271 >> 0x6f;
      auVar233 = auVar271 >> 0x77;
      bVar242 = auVar271[0xf];
      auVar280 = auVar273 >> 7;
      auVar2 = auVar273 >> 0xf;
      auVar10 = auVar273 >> 0x17;
      auVar18 = auVar273 >> 0x1f;
      auVar26 = auVar273 >> 0x27;
      auVar34 = auVar273 >> 0x2f;
      auVar42 = auVar273 >> 0x37;
      auVar66 = auVar273 >> 0x3f;
      auVar90 = auVar273 >> 0x47;
      auVar114 = auVar273 >> 0x4f;
      auVar138 = auVar273 >> 0x57;
      auVar162 = auVar273 >> 0x5f;
      auVar186 = auVar273 >> 0x67;
      auVar210 = auVar273 >> 0x6f;
      auVar234 = auVar273 >> 0x77;
      bVar243 = auVar273[0xf];
      auVar267 = auVar269 >> 7;
      auVar3 = auVar269 >> 0xf;
      auVar11 = auVar269 >> 0x17;
      auVar19 = auVar269 >> 0x1f;
      auVar27 = auVar269 >> 0x27;
      auVar35 = auVar269 >> 0x2f;
      auVar43 = auVar269 >> 0x37;
      auVar67 = auVar269 >> 0x3f;
      auVar91 = auVar269 >> 0x47;
      auVar115 = auVar269 >> 0x4f;
      auVar139 = auVar269 >> 0x57;
      auVar163 = auVar269 >> 0x5f;
      auVar187 = auVar269 >> 0x67;
      auVar211 = auVar269 >> 0x6f;
      auVar235 = auVar269 >> 0x77;
      bVar244 = auVar269[0xf];
      auVar262 = auVar272 >> 7;
      auVar4 = auVar272 >> 0xf;
      auVar12 = auVar272 >> 0x17;
      auVar20 = auVar272 >> 0x1f;
      auVar28 = auVar272 >> 0x27;
      auVar36 = auVar272 >> 0x2f;
      auVar44 = auVar272 >> 0x37;
      auVar68 = auVar272 >> 0x3f;
      auVar92 = auVar272 >> 0x47;
      auVar116 = auVar272 >> 0x4f;
      auVar140 = auVar272 >> 0x57;
      auVar164 = auVar272 >> 0x5f;
      auVar188 = auVar272 >> 0x67;
      auVar212 = auVar272 >> 0x6f;
      auVar236 = auVar272 >> 0x77;
      bVar245 = auVar272[0xf];
      auVar265 = auVar270 >> 7;
      auVar5 = auVar270 >> 0xf;
      auVar13 = auVar270 >> 0x17;
      auVar21 = auVar270 >> 0x1f;
      auVar29 = auVar270 >> 0x27;
      auVar37 = auVar270 >> 0x2f;
      auVar45 = auVar270 >> 0x37;
      auVar69 = auVar270 >> 0x3f;
      auVar93 = auVar270 >> 0x47;
      auVar117 = auVar270 >> 0x4f;
      auVar141 = auVar270 >> 0x57;
      auVar165 = auVar270 >> 0x5f;
      auVar189 = auVar270 >> 0x67;
      auVar213 = auVar270 >> 0x6f;
      auVar237 = auVar270 >> 0x77;
      bVar246 = auVar270[0xf];
      auVar269 = vpaddb_avx(auVar269,auVar269);
      auVar270 = vpaddb_avx(auVar270,auVar270);
      auVar271 = vpaddb_avx(auVar271,auVar271);
      auVar272 = vpaddb_avx(auVar272,auVar272);
      auVar273 = vpaddb_avx(auVar273,auVar273);
      auVar266 = auVar274 >> 7;
      auVar6 = auVar274 >> 0xf;
      auVar14 = auVar274 >> 0x17;
      auVar22 = auVar274 >> 0x1f;
      auVar30 = auVar274 >> 0x27;
      auVar38 = auVar274 >> 0x2f;
      auVar46 = auVar274 >> 0x37;
      auVar70 = auVar274 >> 0x3f;
      auVar94 = auVar274 >> 0x47;
      auVar118 = auVar274 >> 0x4f;
      auVar142 = auVar274 >> 0x57;
      auVar166 = auVar274 >> 0x5f;
      auVar190 = auVar274 >> 0x67;
      auVar214 = auVar274 >> 0x6f;
      auVar238 = auVar274 >> 0x77;
      bVar247 = auVar274[0xf];
      auVar274 = vpaddb_avx(auVar274,auVar274);
      auVar268 = auVar275 >> 7;
      auVar7 = auVar275 >> 0xf;
      auVar15 = auVar275 >> 0x17;
      auVar23 = auVar275 >> 0x1f;
      auVar31 = auVar275 >> 0x27;
      auVar39 = auVar275 >> 0x2f;
      auVar47 = auVar275 >> 0x37;
      auVar71 = auVar275 >> 0x3f;
      auVar95 = auVar275 >> 0x47;
      auVar119 = auVar275 >> 0x4f;
      auVar143 = auVar275 >> 0x57;
      auVar167 = auVar275 >> 0x5f;
      auVar191 = auVar275 >> 0x67;
      auVar215 = auVar275 >> 0x6f;
      auVar239 = auVar275 >> 0x77;
      bVar248 = auVar275[0xf];
      auVar275 = vpaddb_avx(auVar275,auVar275);
      auVar263 = auVar276 >> 7;
      auVar8 = auVar276 >> 0xf;
      auVar16 = auVar276 >> 0x17;
      auVar24 = auVar276 >> 0x1f;
      auVar32 = auVar276 >> 0x27;
      auVar40 = auVar276 >> 0x2f;
      auVar48 = auVar276 >> 0x37;
      auVar72 = auVar276 >> 0x3f;
      auVar96 = auVar276 >> 0x47;
      auVar120 = auVar276 >> 0x4f;
      auVar144 = auVar276 >> 0x57;
      auVar168 = auVar276 >> 0x5f;
      auVar192 = auVar276 >> 0x67;
      auVar216 = auVar276 >> 0x6f;
      auVar240 = auVar276 >> 0x77;
      bVar249 = auVar276[0xf];
      auVar276 = vpaddb_avx(auVar276,auVar276);
      *(int *)((long)flags + lVar261 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar268[0] & 1) | (ushort)(auVar7[0] & 1) << 1 |
                                   (ushort)(auVar15[0] & 1) << 2 | (ushort)(auVar23[0] & 1) << 3 |
                                   (ushort)(auVar31[0] & 1) << 4 | (ushort)(auVar39[0] & 1) << 5 |
                                   (ushort)(auVar47[0] & 1) << 6 | (ushort)(auVar71[0] & 1) << 7 |
                                   (ushort)(auVar95[0] & 1) << 8 | (ushort)(auVar119[0] & 1) << 9 |
                                   (ushort)(auVar143[0] & 1) << 10 |
                                   (ushort)(auVar167[0] & 1) << 0xb |
                                   (ushort)(auVar191[0] & 1) << 0xc |
                                   (ushort)(auVar215[0] & 1) << 0xd |
                                   (ushort)(auVar239[0] & 1) << 0xe | (ushort)(bVar248 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar280[0] & 1) | (ushort)(auVar2[0] & 1) << 1 |
                                   (ushort)(auVar10[0] & 1) << 2 | (ushort)(auVar18[0] & 1) << 3 |
                                   (ushort)(auVar26[0] & 1) << 4 | (ushort)(auVar34[0] & 1) << 5 |
                                   (ushort)(auVar42[0] & 1) << 6 | (ushort)(auVar66[0] & 1) << 7 |
                                   (ushort)(auVar90[0] & 1) << 8 | (ushort)(auVar114[0] & 1) << 9 |
                                   (ushort)(auVar138[0] & 1) << 10 |
                                   (ushort)(auVar162[0] & 1) << 0xb |
                                   (ushort)(auVar186[0] & 1) << 0xc |
                                   (ushort)(auVar210[0] & 1) << 0xd |
                                   (ushort)(auVar234[0] & 1) << 0xe | (ushort)(bVar243 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar279[0] & 1) | (ushort)(auVar264[0] & 1) << 1 |
                                   (ushort)(auVar9[0] & 1) << 2 | (ushort)(auVar17[0] & 1) << 3 |
                                   (ushort)(auVar25[0] & 1) << 4 | (ushort)(auVar33[0] & 1) << 5 |
                                   (ushort)(auVar41[0] & 1) << 6 | (ushort)(auVar65[0] & 1) << 7 |
                                   (ushort)(auVar89[0] & 1) << 8 | (ushort)(auVar113[0] & 1) << 9 |
                                   (ushort)(auVar137[0] & 1) << 10 |
                                   (ushort)(auVar161[0] & 1) << 0xb |
                                   (ushort)(auVar185[0] & 1) << 0xc |
                                   (ushort)(auVar209[0] & 1) << 0xd |
                                   (ushort)(auVar233[0] & 1) << 0xe | (ushort)(bVar242 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar267[0] & 1) | (ushort)(auVar3[0] & 1) << 1 |
                                   (ushort)(auVar11[0] & 1) << 2 | (ushort)(auVar19[0] & 1) << 3 |
                                   (ushort)(auVar27[0] & 1) << 4 | (ushort)(auVar35[0] & 1) << 5 |
                                   (ushort)(auVar43[0] & 1) << 6 | (ushort)(auVar67[0] & 1) << 7 |
                                   (ushort)(auVar91[0] & 1) << 8 | (ushort)(auVar115[0] & 1) << 9 |
                                   (ushort)(auVar139[0] & 1) << 10 |
                                   (ushort)(auVar163[0] & 1) << 0xb |
                                   (ushort)(auVar187[0] & 1) << 0xc |
                                   (ushort)(auVar211[0] & 1) << 0xd |
                                   (ushort)(auVar235[0] & 1) << 0xe | (ushort)(bVar244 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar261 + -4);
      *(int *)((long)flags + lVar261 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar263[0] & 1) | (ushort)(auVar8[0] & 1) << 1 |
                                   (ushort)(auVar16[0] & 1) << 2 | (ushort)(auVar24[0] & 1) << 3 |
                                   (ushort)(auVar32[0] & 1) << 4 | (ushort)(auVar40[0] & 1) << 5 |
                                   (ushort)(auVar48[0] & 1) << 6 | (ushort)(auVar72[0] & 1) << 7 |
                                   (ushort)(auVar96[0] & 1) << 8 | (ushort)(auVar120[0] & 1) << 9 |
                                   (ushort)(auVar144[0] & 1) << 10 |
                                   (ushort)(auVar168[0] & 1) << 0xb |
                                   (ushort)(auVar192[0] & 1) << 0xc |
                                   (ushort)(auVar216[0] & 1) << 0xd |
                                   (ushort)(auVar240[0] & 1) << 0xe | (ushort)(bVar249 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar266[0] & 1) | (ushort)(auVar6[0] & 1) << 1 |
                                   (ushort)(auVar14[0] & 1) << 2 | (ushort)(auVar22[0] & 1) << 3 |
                                   (ushort)(auVar30[0] & 1) << 4 | (ushort)(auVar38[0] & 1) << 5 |
                                   (ushort)(auVar46[0] & 1) << 6 | (ushort)(auVar70[0] & 1) << 7 |
                                   (ushort)(auVar94[0] & 1) << 8 | (ushort)(auVar118[0] & 1) << 9 |
                                   (ushort)(auVar142[0] & 1) << 10 |
                                   (ushort)(auVar166[0] & 1) << 0xb |
                                   (ushort)(auVar190[0] & 1) << 0xc |
                                   (ushort)(auVar214[0] & 1) << 0xd |
                                   (ushort)(auVar238[0] & 1) << 0xe | (ushort)(bVar247 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar262[0] & 1) | (ushort)(auVar4[0] & 1) << 1 |
                                   (ushort)(auVar12[0] & 1) << 2 | (ushort)(auVar20[0] & 1) << 3 |
                                   (ushort)(auVar28[0] & 1) << 4 | (ushort)(auVar36[0] & 1) << 5 |
                                   (ushort)(auVar44[0] & 1) << 6 | (ushort)(auVar68[0] & 1) << 7 |
                                   (ushort)(auVar92[0] & 1) << 8 | (ushort)(auVar116[0] & 1) << 9 |
                                   (ushort)(auVar140[0] & 1) << 10 |
                                   (ushort)(auVar164[0] & 1) << 0xb |
                                   (ushort)(auVar188[0] & 1) << 0xc |
                                   (ushort)(auVar212[0] & 1) << 0xd |
                                   (ushort)(auVar236[0] & 1) << 0xe | (ushort)(bVar245 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar265[0] & 1) | (ushort)(auVar5[0] & 1) << 1 |
                                   (ushort)(auVar13[0] & 1) << 2 | (ushort)(auVar21[0] & 1) << 3 |
                                   (ushort)(auVar29[0] & 1) << 4 | (ushort)(auVar37[0] & 1) << 5 |
                                   (ushort)(auVar45[0] & 1) << 6 | (ushort)(auVar69[0] & 1) << 7 |
                                   (ushort)(auVar93[0] & 1) << 8 | (ushort)(auVar117[0] & 1) << 9 |
                                   (ushort)(auVar141[0] & 1) << 10 |
                                   (ushort)(auVar165[0] & 1) << 0xb |
                                   (ushort)(auVar189[0] & 1) << 0xc |
                                   (ushort)(auVar213[0] & 1) << 0xd |
                                   (ushort)(auVar237[0] & 1) << 0xe | (ushort)(bVar246 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar261 + 0x1c);
      lVar261 = lVar261 + -4;
    } while (lVar261 != 0);
    uVar260 = uVar258;
    auVar279 = _DAT_00116060;
    auVar280 = _DAT_00116070;
    uVar259 = uVar258 + 8;
  }
  while (uVar259 = uVar260 + 4, _DAT_00116060 = auVar269, _DAT_00116070 = auVar270,
        uVar259 <= uVar241) {
    lVar261 = 0x20;
    auVar277 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8),auVar279,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 8));
    auVar278 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 8),auVar280,
                                 *(undefined1 (*) [16])(array + uVar260 * 8));
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x10),auVar279,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x18));
    auVar272 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 0x18),auVar280,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 0x10));
    do {
      auVar269 = auVar277 >> 7;
      auVar275 = auVar277 >> 0xf;
      auVar265 = auVar277 >> 0x17;
      auVar264 = auVar277 >> 0x1f;
      auVar5 = auVar277 >> 0x27;
      auVar9 = auVar277 >> 0x2f;
      auVar13 = auVar277 >> 0x37;
      auVar17 = auVar277 >> 0x3f;
      auVar21 = auVar277 >> 0x47;
      auVar25 = auVar277 >> 0x4f;
      auVar29 = auVar277 >> 0x57;
      auVar33 = auVar277 >> 0x5f;
      auVar37 = auVar277 >> 0x67;
      auVar41 = auVar277 >> 0x6f;
      auVar45 = auVar277 >> 0x77;
      bVar242 = auVar277[0xf];
      auVar270 = auVar278 >> 7;
      auVar276 = auVar278 >> 0xf;
      auVar266 = auVar278 >> 0x17;
      auVar2 = auVar278 >> 0x1f;
      auVar6 = auVar278 >> 0x27;
      auVar10 = auVar278 >> 0x2f;
      auVar14 = auVar278 >> 0x37;
      auVar18 = auVar278 >> 0x3f;
      auVar22 = auVar278 >> 0x47;
      auVar26 = auVar278 >> 0x4f;
      auVar30 = auVar278 >> 0x57;
      auVar34 = auVar278 >> 0x5f;
      auVar38 = auVar278 >> 0x67;
      auVar42 = auVar278 >> 0x6f;
      auVar46 = auVar278 >> 0x77;
      bVar243 = auVar278[0xf];
      auVar273 = auVar271 >> 7;
      auVar267 = auVar271 >> 0xf;
      auVar268 = auVar271 >> 0x17;
      auVar3 = auVar271 >> 0x1f;
      auVar7 = auVar271 >> 0x27;
      auVar11 = auVar271 >> 0x2f;
      auVar15 = auVar271 >> 0x37;
      auVar19 = auVar271 >> 0x3f;
      auVar23 = auVar271 >> 0x47;
      auVar27 = auVar271 >> 0x4f;
      auVar31 = auVar271 >> 0x57;
      auVar35 = auVar271 >> 0x5f;
      auVar39 = auVar271 >> 0x67;
      auVar43 = auVar271 >> 0x6f;
      auVar47 = auVar271 >> 0x77;
      bVar244 = auVar271[0xf];
      auVar277 = vpaddb_avx(auVar277,auVar277);
      auVar278 = vpaddb_avx(auVar278,auVar278);
      auVar271 = vpaddb_avx(auVar271,auVar271);
      auVar274 = auVar272 >> 7;
      auVar262 = auVar272 >> 0xf;
      auVar263 = auVar272 >> 0x17;
      auVar4 = auVar272 >> 0x1f;
      auVar8 = auVar272 >> 0x27;
      auVar12 = auVar272 >> 0x2f;
      auVar16 = auVar272 >> 0x37;
      auVar20 = auVar272 >> 0x3f;
      auVar24 = auVar272 >> 0x47;
      auVar28 = auVar272 >> 0x4f;
      auVar32 = auVar272 >> 0x57;
      auVar36 = auVar272 >> 0x5f;
      auVar40 = auVar272 >> 0x67;
      auVar44 = auVar272 >> 0x6f;
      auVar48 = auVar272 >> 0x77;
      bVar245 = auVar272[0xf];
      auVar272 = vpaddb_avx(auVar272,auVar272);
      *(int *)((long)flags + lVar261 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar273[0] & 1) | (ushort)(auVar267[0] & 1) << 1 |
                                   (ushort)(auVar268[0] & 1) << 2 | (ushort)(auVar3[0] & 1) << 3 |
                                   (ushort)(auVar7[0] & 1) << 4 | (ushort)(auVar11[0] & 1) << 5 |
                                   (ushort)(auVar15[0] & 1) << 6 | (ushort)(auVar19[0] & 1) << 7 |
                                   (ushort)(auVar23[0] & 1) << 8 | (ushort)(auVar27[0] & 1) << 9 |
                                   (ushort)(auVar31[0] & 1) << 10 | (ushort)(auVar35[0] & 1) << 0xb
                                   | (ushort)(auVar39[0] & 1) << 0xc |
                                   (ushort)(auVar43[0] & 1) << 0xd | (ushort)(auVar47[0] & 1) << 0xe
                                  | (ushort)(bVar244 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar269[0] & 1) | (ushort)(auVar275[0] & 1) << 1 |
                                   (ushort)(auVar265[0] & 1) << 2 | (ushort)(auVar264[0] & 1) << 3 |
                                   (ushort)(auVar5[0] & 1) << 4 | (ushort)(auVar9[0] & 1) << 5 |
                                   (ushort)(auVar13[0] & 1) << 6 | (ushort)(auVar17[0] & 1) << 7 |
                                   (ushort)(auVar21[0] & 1) << 8 | (ushort)(auVar25[0] & 1) << 9 |
                                   (ushort)(auVar29[0] & 1) << 10 | (ushort)(auVar33[0] & 1) << 0xb
                                   | (ushort)(auVar37[0] & 1) << 0xc |
                                   (ushort)(auVar41[0] & 1) << 0xd | (ushort)(auVar45[0] & 1) << 0xe
                                  | (ushort)(bVar242 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar261 + -4);
      *(int *)((long)flags + lVar261 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar274[0] & 1) | (ushort)(auVar262[0] & 1) << 1 |
                                   (ushort)(auVar263[0] & 1) << 2 | (ushort)(auVar4[0] & 1) << 3 |
                                   (ushort)(auVar8[0] & 1) << 4 | (ushort)(auVar12[0] & 1) << 5 |
                                   (ushort)(auVar16[0] & 1) << 6 | (ushort)(auVar20[0] & 1) << 7 |
                                   (ushort)(auVar24[0] & 1) << 8 | (ushort)(auVar28[0] & 1) << 9 |
                                   (ushort)(auVar32[0] & 1) << 10 | (ushort)(auVar36[0] & 1) << 0xb
                                   | (ushort)(auVar40[0] & 1) << 0xc |
                                   (ushort)(auVar44[0] & 1) << 0xd | (ushort)(auVar48[0] & 1) << 0xe
                                  | (ushort)(bVar245 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar270[0] & 1) | (ushort)(auVar276[0] & 1) << 1 |
                                   (ushort)(auVar266[0] & 1) << 2 | (ushort)(auVar2[0] & 1) << 3 |
                                   (ushort)(auVar6[0] & 1) << 4 | (ushort)(auVar10[0] & 1) << 5 |
                                   (ushort)(auVar14[0] & 1) << 6 | (ushort)(auVar18[0] & 1) << 7 |
                                   (ushort)(auVar22[0] & 1) << 8 | (ushort)(auVar26[0] & 1) << 9 |
                                   (ushort)(auVar30[0] & 1) << 10 | (ushort)(auVar34[0] & 1) << 0xb
                                   | (ushort)(auVar38[0] & 1) << 0xc |
                                   (ushort)(auVar42[0] & 1) << 0xd | (ushort)(auVar46[0] & 1) << 0xe
                                  | (ushort)(bVar243 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar261 + 0x1c);
      lVar261 = lVar261 + -4;
      auVar269 = _DAT_00116060;
      auVar270 = _DAT_00116070;
      uVar260 = uVar259;
    } while (lVar261 != 0);
  }
  while (uVar259 = uVar260 + 2, uVar259 <= uVar241) {
    lVar261 = 0x20;
    auVar279 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8),auVar269,
                                 *(undefined1 (*) [16])(array + uVar260 * 8 + 8));
    auVar280 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar260 * 8 + 8),auVar270,
                                 *(undefined1 (*) [16])(array + uVar260 * 8));
    do {
      auVar277 = auVar279 >> 7;
      auVar278 = auVar279 >> 0xf;
      auVar271 = auVar279 >> 0x17;
      auVar272 = auVar279 >> 0x1f;
      auVar273 = auVar279 >> 0x27;
      auVar274 = auVar279 >> 0x2f;
      auVar275 = auVar279 >> 0x37;
      auVar276 = auVar279 >> 0x3f;
      auVar267 = auVar279 >> 0x47;
      auVar262 = auVar279 >> 0x4f;
      auVar265 = auVar279 >> 0x57;
      auVar266 = auVar279 >> 0x5f;
      auVar268 = auVar279 >> 0x67;
      auVar263 = auVar279 >> 0x6f;
      auVar264 = auVar279 >> 0x77;
      bVar242 = auVar279[0xf];
      auVar279 = vpaddb_avx(auVar279,auVar279);
      piVar1 = (int *)((long)flags + lVar261 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(auVar277[0] & 1) |
                                                  (ushort)(auVar278[0] & 1) << 1 |
                                                  (ushort)(auVar271[0] & 1) << 2 |
                                                  (ushort)(auVar272[0] & 1) << 3 |
                                                  (ushort)(auVar273[0] & 1) << 4 |
                                                  (ushort)(auVar274[0] & 1) << 5 |
                                                  (ushort)(auVar275[0] & 1) << 6 |
                                                  (ushort)(auVar276[0] & 1) << 7 |
                                                  (ushort)(auVar267[0] & 1) << 8 |
                                                  (ushort)(auVar262[0] & 1) << 9 |
                                                  (ushort)(auVar265[0] & 1) << 10 |
                                                  (ushort)(auVar266[0] & 1) << 0xb |
                                                  (ushort)(auVar268[0] & 1) << 0xc |
                                                  (ushort)(auVar263[0] & 1) << 0xd |
                                                  (ushort)(auVar264[0] & 1) << 0xe |
                                                 (ushort)(bVar242 >> 7) << 0xf));
      auVar277 = auVar280 >> 7;
      auVar278 = auVar280 >> 0xf;
      auVar271 = auVar280 >> 0x17;
      auVar272 = auVar280 >> 0x1f;
      auVar273 = auVar280 >> 0x27;
      auVar274 = auVar280 >> 0x2f;
      auVar275 = auVar280 >> 0x37;
      auVar276 = auVar280 >> 0x3f;
      auVar267 = auVar280 >> 0x47;
      auVar262 = auVar280 >> 0x4f;
      auVar265 = auVar280 >> 0x57;
      auVar266 = auVar280 >> 0x5f;
      auVar268 = auVar280 >> 0x67;
      auVar263 = auVar280 >> 0x6f;
      auVar264 = auVar280 >> 0x77;
      bVar242 = auVar280[0xf];
      auVar280 = vpaddb_avx(auVar280,auVar280);
      piVar1 = (int *)((long)flags + lVar261 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(auVar277[0] & 1) |
                                                  (ushort)(auVar278[0] & 1) << 1 |
                                                  (ushort)(auVar271[0] & 1) << 2 |
                                                  (ushort)(auVar272[0] & 1) << 3 |
                                                  (ushort)(auVar273[0] & 1) << 4 |
                                                  (ushort)(auVar274[0] & 1) << 5 |
                                                  (ushort)(auVar275[0] & 1) << 6 |
                                                  (ushort)(auVar276[0] & 1) << 7 |
                                                  (ushort)(auVar267[0] & 1) << 8 |
                                                  (ushort)(auVar262[0] & 1) << 9 |
                                                  (ushort)(auVar265[0] & 1) << 10 |
                                                  (ushort)(auVar266[0] & 1) << 0xb |
                                                  (ushort)(auVar268[0] & 1) << 0xc |
                                                  (ushort)(auVar263[0] & 1) << 0xd |
                                                  (ushort)(auVar264[0] & 1) << 0xe |
                                                 (ushort)(bVar242 >> 7) << 0xf));
      lVar261 = lVar261 + -4;
      uVar260 = uVar259;
    } while (lVar261 != 0);
  }
  uVar260 = uVar260 << 3;
  if (uVar260 < len) {
    auVar281 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar282 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar283 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar260 = uVar260 + 1;
      auVar284 = vpbroadcastd_avx512f();
      auVar284 = vpsrlvd_avx512f(auVar284,auVar282);
      auVar284 = vpandd_avx512f(auVar284,auVar283);
      auVar281 = vpaddd_avx512f(auVar284,auVar281);
    } while (len != uVar260);
    auVar281 = vmovdqu64_avx512f(auVar281);
    *(undefined1 (*) [64])flags = auVar281;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
        U(8,9) U(10,11) U(12,13) U(14,15)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2,  3) A( 4, 5) A( 6,  7)
            A(8,9) A(10, 11) A(12,13) A(14, 15)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2,  3) P( 4, 5) P( 6,  7)
            P(8,9) P(10, 11) P(12,13) P(14, 15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3) A(4,5) A(6, 7)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}